

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VtabUnlock(VTable *pVTab)

{
  int *piVar1;
  sqlite3 *db;
  sqlite3_vtab *psVar2;
  
  db = pVTab->db;
  piVar1 = &pVTab->nRef;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  psVar2 = pVTab->pVtab;
  if (psVar2 != (sqlite3_vtab *)0x0) {
    (*psVar2->pModule->xDisconnect)(psVar2);
  }
  sqlite3DbFreeNN(db,pVTab);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabUnlock(VTable *pVTab){
  sqlite3 *db = pVTab->db;

  assert( db );
  assert( pVTab->nRef>0 );
  assert( db->magic==SQLITE_MAGIC_OPEN || db->magic==SQLITE_MAGIC_ZOMBIE );

  pVTab->nRef--;
  if( pVTab->nRef==0 ){
    sqlite3_vtab *p = pVTab->pVtab;
    if( p ){
      p->pModule->xDisconnect(p);
    }
    sqlite3DbFree(db, pVTab);
  }
}